

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

void __thiscall
fmt::v9::dynamic_format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>::
emplace_arg<char>(dynamic_format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>
                  *this,char *arg)

{
  char *in_RDX;
  basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> local_38;
  char *local_18;
  char *arg_local;
  dynamic_format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *this_local;
  
  local_18 = arg;
  arg_local = (char *)this;
  v9::detail::make_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const&>
            (&local_38,(detail *)arg,in_RDX);
  std::
  vector<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>>
  ::emplace_back<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>
            ((vector<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>>
              *)this,&local_38);
  return;
}

Assistant:

void emplace_arg(const T& arg) {
    data_.emplace_back(detail::make_arg<Context>(arg));
  }